

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  SchemaElementDecl *pSVar2;
  size_t __n;
  void *__buf;
  int key2;
  int key1;
  void *strkey;
  RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> e;
  uint local_78;
  int local_74;
  void *local_70;
  RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> local_68;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    XSerializeEngine::writeSize(serEng,objToStore->fHashModulus);
    RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
    RefHash3KeysIdPoolEnumerator(&local_68,objToStore,false,objToStore->fMemoryManager);
    XSerializeEngine::writeSize(serEng,(local_68.fToEnum)->fIdCounter);
    while ((local_68.fCurElem != (RefHash3KeysTableBucketElem<xercesc_4_0::SchemaElementDecl> *)0x0
           || (local_68.fCurHash != (local_68.fToEnum)->fHashModulus))) {
      RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
      nextElementKey(&local_68,&local_70,&local_74,(int *)&local_78);
      XSerializeEngine::operator<<(serEng,local_78);
      __n = (size_t)local_78;
      pSVar2 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
               getByKey(objToStore,local_70,local_74,local_78);
      XSerializeEngine::write(serEng,(int)pSVar2,__buf,__n);
    }
    RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
    ~RefHash3KeysIdPoolEnumerator(&local_68);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefHash3KeysIdPool<SchemaElementDecl>* const objToStore
                                    , XSerializeEngine&                            serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        serEng.writeSize (objToStore->getHashModulus());

        RefHash3KeysIdPoolEnumerator<SchemaElementDecl> e(objToStore, false, objToStore->getMemoryManager());

        serEng.writeSize (e.size());

        void*  strkey;
        int    key1;
        int    key2;
        /* Update to store key2 separately as for the putGroupElemDecl the key is not the
           enclosing scope but another value. */
        while (e.hasMoreKeys())
        {
            e.nextElementKey(strkey, key1, key2);
            serEng<<key2;
            SchemaElementDecl* data = objToStore->getByKey(strkey, key1, key2);
            serEng<<data;
        }
    }

}